

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O3

Node * __thiscall
SQCompilation::ClosureHoistingOpt::RemapTransformer::transformDeclExpr
          (RemapTransformer *this,DeclExpr *e)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  Chunk *pCVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  
  pNVar1 = (Node *)e->_decl;
  p_Var7 = (this->relocSet->
           super_set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var5 = &(this->relocSet->
              super_set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
              )._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var5->_M_header;
    do {
      if (*(DeclExpr **)(p_Var7 + 1) >= e) {
        p_Var8 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(DeclExpr **)(p_Var7 + 1) < e];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var5) && (*(DeclExpr **)(p_Var8 + 1) <= e))
    goto LAB_0014be38;
  }
  if (pNVar1->_op == TO_FUNCTION) {
    p_Var7 = (this->relocMap->
             super_map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 != (_Base_ptr)0x0) {
      p_Var5 = &(this->relocMap->
                super_map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
                )._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var5->_M_header;
      do {
        if (*(Node **)(p_Var7 + 1) >= pNVar1) {
          p_Var8 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[*(Node **)(p_Var7 + 1) < pNVar1];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 != p_Var5) && (*(Node **)(p_Var8 + 1) <= pNVar1)) {
        p_Var7 = p_Var8[1]._M_parent;
        pCVar6 = Arena::findChunk(this->astArena,0x28);
        pNVar1 = (Node *)pCVar6->_ptr;
        pCVar6->_ptr = (uint8_t *)&pNVar1[1]._coordinates;
        pNVar1->_op = TO_ID;
        (pNVar1->_coordinates).lineStart = -1;
        (pNVar1->_coordinates).columnStart = -1;
        (pNVar1->_coordinates).lineEnd = -1;
        (pNVar1->_coordinates).columnEnd = -1;
        (pNVar1->super_ArenaObj)._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2b50;
        pNVar1[1].super_ArenaObj._vptr_ArenaObj = (_func_int **)p_Var7;
        iVar2 = (e->super_Expr).super_Node._coordinates.columnStart;
        iVar3 = (e->super_Expr).super_Node._coordinates.lineEnd;
        iVar4 = (e->super_Expr).super_Node._coordinates.columnEnd;
        (pNVar1->_coordinates).lineStart = (e->super_Expr).super_Node._coordinates.lineStart;
        (pNVar1->_coordinates).columnStart = iVar2;
        (pNVar1->_coordinates).lineEnd = iVar3;
        (pNVar1->_coordinates).columnEnd = iVar4;
        return pNVar1;
      }
    }
  }
LAB_0014be38:
  Node::transformChildren(pNVar1,&this->super_Transformer);
  return (Node *)e;
}

Assistant:

Node *ClosureHoistingOpt::RemapTransformer::transformDeclExpr(DeclExpr *e) {

  Decl *d = e->declaration();
  auto it = relocSet.find(e);
  if (it == relocSet.end()) {
    if (d->op() == TO_FUNCTION) {
      FunctionDecl *f = (FunctionDecl *)d;
      auto it = relocMap.find(f);
      if (it != relocMap.end()) {
        return copyCoordinates(e, createId(it->second));
      }
    }
  }

  d->transformChildren(this);
  return e;
}